

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStructGet(BinaryInstWriter *this,StructGet *curr)

{
  MemoryOrder MVar1;
  pointer pFVar2;
  bool bVar3;
  uint uVar4;
  Struct *pSVar5;
  BufferWithRandomAccess *this_00;
  U32LEB x;
  HeapType local_30;
  
  bVar3 = wasm::Type::isNull(&curr->ref->type);
  if (bVar3) {
    emitUnreachable(this);
    return;
  }
  local_30 = wasm::Type::getHeapType(&curr->ref->type);
  pSVar5 = HeapType::getStruct(&local_30);
  MVar1 = curr->order;
  pFVar2 = (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pFVar2[curr->index].type.id == 2) && (pFVar2[curr->index].packedType != not_packed)) {
    if (curr->signed_ == true) {
      uVar4 = 3;
      x.value = 0x5d;
    }
    else {
      uVar4 = 4;
      x.value = 0x5e;
    }
  }
  else {
    uVar4 = 2;
    x.value = 0x5c;
  }
  if (MVar1 == Unordered) {
    x.value = uVar4;
  }
  this_00 = BufferWithRandomAccess::operator<<(this->o,(MVar1 != Unordered) * '\x03' + -5);
  BufferWithRandomAccess::operator<<(this_00,x);
  if (MVar1 != Unordered) {
    WasmBinaryWriter::writeMemoryOrder(this->parent,curr->order,false);
  }
  WasmBinaryWriter::writeIndexedHeapType(this->parent,local_30);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)curr->index);
  return;
}

Assistant:

void BinaryInstWriter::visitStructGet(StructGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  const auto& heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getStruct().fields[curr->index];
  bool atomic = curr->order != MemoryOrder::Unordered;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = atomic ? BinaryConsts::StructAtomicGet : BinaryConsts::StructGet;
  } else if (curr->signed_) {
    op = atomic ? BinaryConsts::StructAtomicGetS : BinaryConsts::StructGetS;
  } else {
    op = atomic ? BinaryConsts::StructAtomicGetU : BinaryConsts::StructGetU;
  }
  auto prefix = atomic ? BinaryConsts::AtomicPrefix : BinaryConsts::GCPrefix;
  o << int8_t(prefix) << U32LEB(op);
  if (atomic) {
    parent.writeMemoryOrder(curr->order);
  }
  parent.writeIndexedHeapType(heapType);
  o << U32LEB(curr->index);
}